

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::OneSlopeTestCase::testPolygonOffset(OneSlopeTestCase *this)

{
  code *pcVar1;
  TestContext *testCtx;
  undefined *puVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestError *this_01;
  ConstPixelBufferAccess local_1420;
  ConstPixelBufferAccess local_13f8;
  Vector<float,_4> local_13d0;
  PixelBufferAccess local_13c0;
  MessageBuilder local_1398;
  PixelBufferAccess local_1218;
  MessageBuilder local_11f0;
  MessageBuilder local_1070;
  MessageBuilder local_ef0;
  MessageBuilder local_d70;
  MessageBuilder local_bf0;
  MessageBuilder local_a70;
  undefined4 local_8ec;
  undefined4 local_8e8;
  GLint colorLoc;
  GLint positionLoc;
  allocator<char> local_8b9;
  string local_8b8;
  ProgramSources local_898;
  undefined1 local_7c8 [8];
  ShaderProgram program;
  Functions *gl;
  float local_6e8;
  float local_6e4;
  MessageBuilder local_6e0;
  ulong local_560;
  size_t ndx_1;
  float local_3d8;
  float local_3d4;
  float local_3d0;
  float local_3cc;
  MessageBuilder local_3c8;
  ulong local_248;
  size_t ndx;
  undefined1 local_b0 [8];
  Surface referenceImage;
  Surface testImage;
  TestLog *log;
  Vec4 triangles [2] [3];
  float cornerDepth;
  OneSlopeTestCase *this_local;
  
  triangles[1][2].m_data[3] = (float)(this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&log,-1.0,-1.0,-triangles[1][2].m_data[3],1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangles[0][0].m_data + 2),-1.0,1.0,-triangles[1][2].m_data[3],
             1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangles[0][1].m_data + 2),1.0,-1.0,triangles[1][2].m_data[3],1.0
            );
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangles[0][2].m_data + 2),-1.0,1.0,triangles[1][2].m_data[3],1.0
            );
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangles[1][0].m_data + 2),1.0,1.0,triangles[1][2].m_data[3],1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangles[1][1].m_data + 2),1.0,-1.0,-triangles[1][2].m_data[3],
             1.0);
  this_00 = tcu::TestContext::getLog
                      ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)&referenceImage.m_pixels.m_cap,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)local_b0,iVar4,iVar4);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ndx,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&ndx,
                      (char (*) [65])
                      "Setup triangle0 coordinates: (slope in window coordinates = 1.0)");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
  for (local_248 = 0; local_248 < 3; local_248 = local_248 + 1) {
    tcu::TestLog::operator<<(&local_3c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_3c8,(char (*) [4])"\tx=");
    local_3cc = tcu::Vector<float,_4>::x
                          ((Vector<float,_4> *)(triangles[-1][local_248 + 2].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3cc);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\ty=");
    local_3d0 = tcu::Vector<float,_4>::y
                          ((Vector<float,_4> *)(triangles[-1][local_248 + 2].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3d0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\tz=");
    local_3d4 = tcu::Vector<float,_4>::z
                          ((Vector<float,_4> *)(triangles[-1][local_248 + 2].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3d4);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\tw=");
    local_3d8 = tcu::Vector<float,_4>::w
                          ((Vector<float,_4> *)(triangles[-1][local_248 + 2].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3d8);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3c8);
  }
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ndx_1,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&ndx_1,
                      (char (*) [65])
                      "Setup triangle1 coordinates: (slope in window coordinates = 1.0)");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx_1);
  for (local_560 = 0; local_560 < 3; local_560 = local_560 + 1) {
    tcu::TestLog::operator<<(&local_6e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_6e0,(char (*) [4])"\tx=");
    local_6e4 = tcu::Vector<float,_4>::x
                          ((Vector<float,_4> *)(triangles[0][local_560 + 2].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6e4);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\ty=");
    local_6e8 = tcu::Vector<float,_4>::y
                          ((Vector<float,_4> *)(triangles[0][local_560 + 2].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6e8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\tz=");
    gl._4_4_ = tcu::Vector<float,_4>::z
                         ((Vector<float,_4> *)(triangles[0][local_560 + 2].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)((long)&gl + 4));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])"\tw=");
    gl._0_4_ = tcu::Vector<float,_4>::w
                         ((Vector<float,_4> *)(triangles[0][local_560 + 2].m_data + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)&gl);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6e0);
  }
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceVertex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,puVar2,&local_8b9);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceFragment;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positionLoc,puVar2,(allocator<char> *)((long)&colorLoc + 3));
  glu::makeVtxFragSources(&local_898,&local_8b8,(string *)&positionLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_7c8,pRVar7,&local_898);
  glu::ProgramSources::~ProgramSources(&local_898);
  std::__cxx11::string::~string((string *)&positionLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&colorLoc + 3));
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator(&local_8b9);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_7c8);
  local_8e8 = (*pcVar1)(dVar5,"a_position");
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_7c8);
  local_8ec = (*pcVar1)(dVar5,"a_color");
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_7c8);
  if (!bVar3) {
    glu::operator<<(this_00,(ShaderProgram *)local_7c8);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Shader compile failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
               ,0x464);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1c0))(0,0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x4000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1a00))
            (0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_7c8);
  (*pcVar1)(dVar5);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0xb71);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0x8037);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x610))(local_8e8);
  tcu::TestLog::operator<<(&local_a70,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_a70,(char (*) [42])"Framebuffer cleared, clear color = Black.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a70);
  tcu::TestLog::operator<<(&local_bf0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_bf0,(char (*) [29])0x2b7f2b3);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_bf0);
  tcu::TestLog::operator<<(&local_d70,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_d70,(char (*) [20])"Clear depth to 1.0.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_d70);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1d0))(0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x100);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))(local_8e8,4,0x1406,0,0,&log);
  tcu::TestLog::operator<<(&local_ef0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_ef0,
                      (char (*) [116])
                      "Draw triangle0. Color = Red.\tState: DepthFunc = NOTEQUAL, PolygonOffset(10, 0). (Result depth should clamp to 1.0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_ef0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0x41200000,0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x205);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0x3f800000,0,local_8ec);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  tcu::TestLog::operator<<(&local_1070,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1070,(char (*) [20])"Clear depth to 0.0.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1070);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1d0))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x100);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))
            (local_8e8,4,0x1406,0,0,triangles[0][2].m_data + 2);
  tcu::TestLog::operator<<(&local_11f0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_11f0,
                      (char (*) [119])
                      "Draw triangle1. Color = Green.\tState: DepthFunc = NOTEQUAL, PolygonOffset(-10, 0). (Result depth should clamp to 0.0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_11f0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0xc1200000,0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x205);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0,0x3f800000,local_8ec);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x518))(local_8e8);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1680))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x648))();
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_1218,(Surface *)&referenceImage.m_pixels.m_cap);
  glu::readPixels(pRVar7,0,0,&local_1218);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_7c8);
  tcu::TestLog::operator<<(&local_1398,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1398,(char (*) [29])"Expecting black framebuffer.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1398);
  tcu::Surface::getAccess(&local_13c0,(Surface *)local_b0);
  tcu::Vector<float,_4>::Vector(&local_13d0,0.0,0.0,0.0,1.0);
  tcu::clear(&local_13c0,&local_13d0);
  testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&local_13f8,(Surface *)&referenceImage.m_pixels.m_cap);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1420,(Surface *)local_b0);
  verifyImages(this_00,testCtx,pRVar7,&local_13f8,&local_1420);
  tcu::Surface::~Surface((Surface *)local_b0);
  tcu::Surface::~Surface((Surface *)&referenceImage.m_pixels.m_cap);
  return;
}

Assistant:

void OneSlopeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	/*
		* setup vertices subject to following properties
		*   dz_w / dx_w == 1
		*   dz_w / dy_w == 0
		* or
		*   dz_w / dx_w == 0
		*   dz_w / dy_w == 1
		* ==> m == 1
		*/
	const float cornerDepth = float(m_targetSize);
	const tcu::Vec4 triangles[2][3] =
	{
		{
			tcu::Vec4(-1, -1, -cornerDepth, 1),
			tcu::Vec4(-1,  1, -cornerDepth, 1),
			tcu::Vec4( 1, -1,  cornerDepth, 1),
		},
		{
			tcu::Vec4(-1,  1,  cornerDepth, 1),
			tcu::Vec4( 1,  1,  cornerDepth, 1),
			tcu::Vec4( 1, -1, -cornerDepth, 1),
		},
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// log triangle info
	log << TestLog::Message << "Setup triangle0 coordinates: (slope in window coordinates = 1.0)" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangles[0]); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangles[0][ndx].x()
				<< "\ty=" << triangles[0][ndx].y()
				<< "\tz=" << triangles[0][ndx].z()
				<< "\tw=" << triangles[0][ndx].w()
				<< TestLog::EndMessage;
	log << TestLog::Message << "Setup triangle1 coordinates: (slope in window coordinates = 1.0)" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangles[1]); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangles[1][ndx].x()
				<< "\ty=" << triangles[1][ndx].y()
				<< "\tz=" << triangles[1][ndx].z()
				<< "\tw=" << triangles[1][ndx].w()
				<< TestLog::EndMessage;

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clear					(GL_COLOR_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "Framebuffer cleared, clear color = Black." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		// top left (positive offset)
		{
			log << TestLog::Message << "Clear depth to 1.0." << TestLog::EndMessage;

			gl.clearDepthf			(1.0f); // far
			gl.clear				(GL_DEPTH_BUFFER_BIT);

			gl.vertexAttribPointer	(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangles[0]);

			log << TestLog::Message << "Draw triangle0. Color = Red.\tState: DepthFunc = NOTEQUAL, PolygonOffset(10, 0). (Result depth should clamp to 1.0)." << TestLog::EndMessage;

			gl.polygonOffset		(10, 0);		// clamps any depth on the triangle to 1
			gl.depthFunc			(GL_NOTEQUAL);
			gl.vertexAttrib4f		(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays			(GL_TRIANGLES, 0, 3);
		}
		// bottom right (negative offset)
		{
			log << TestLog::Message << "Clear depth to 0.0." << TestLog::EndMessage;

			gl.clearDepthf			(0.0f); // far
			gl.clear				(GL_DEPTH_BUFFER_BIT);

			gl.vertexAttribPointer	(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangles[1]);

			log << TestLog::Message << "Draw triangle1. Color = Green.\tState: DepthFunc = NOTEQUAL, PolygonOffset(-10, 0). (Result depth should clamp to 0.0)." << TestLog::EndMessage;

			gl.polygonOffset		(-10, 0); // clamps depth to 0
			gl.depthFunc			(GL_NOTEQUAL);
			gl.vertexAttrib4f		(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays			(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black framebuffer." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}